

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaCommand.cxx
# Opt level: O2

bool __thiscall MetaCommand::OptionExistsByMinusTag(MetaCommand *this,string *minusTag)

{
  pointer pOVar1;
  __type _Var2;
  pointer pOVar3;
  string tagToSearch;
  allocator local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pOVar3 = (this->m_OptionVector).
           super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>._M_impl.
           super__Vector_impl_data._M_start;
  do {
    pOVar1 = (this->m_OptionVector).
             super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pOVar3 == pOVar1) {
LAB_00117b2d:
      return pOVar3 != pOVar1;
    }
    std::__cxx11::string::string((string *)&local_50,"-",&local_51);
    std::__cxx11::string::append((string *)&local_50);
    _Var2 = std::operator==(&local_50,minusTag);
    if (_Var2) {
      std::__cxx11::string::~string((string *)&local_50);
      goto LAB_00117b2d;
    }
    std::__cxx11::string::~string((string *)&local_50);
    pOVar3 = pOVar3 + 1;
  } while( true );
}

Assistant:

bool
MetaCommand::OptionExistsByMinusTag(METAIO_STL::string minusTag)
{
  OptionVector::const_iterator it = m_OptionVector.begin();
  while(it != m_OptionVector.end())
    {
    METAIO_STL::string tagToSearch = "-";
    tagToSearch += (*it).tag;
    if(tagToSearch == minusTag)
      {
      return true;
      }
    ++it;
    }

  return false;

}